

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O1

string * __thiscall
flatbuffers::ts::TsGenerator::GenUnionValTS
          (string *__return_storage_ptr__,TsGenerator *this,import_set *imports,StructDef *dependent
          ,string *field_name,Type *union_type,bool is_array)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  EnumDef *dependency;
  pointer ppEVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  size_type *psVar8;
  ulong *puVar9;
  undefined8 uVar10;
  EnumDef *union_enum;
  string conversion_function;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> field_binded_method;
  string enum_type;
  string union_accessor;
  long *local_278;
  long local_268;
  long lStack_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  string local_238;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8;
  long *local_1b8;
  long local_1b0;
  long local_1a8;
  long lStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_198;
  pointer local_190;
  EnumVal **local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  ImportDefinition local_100;
  
  dependency = union_type->enum_def;
  if (dependency == (EnumDef *)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_ts.cpp"
                  ,0x454,
                  "std::string flatbuffers::ts::TsGenerator::GenUnionValTS(import_set &, const StructDef &, const std::string &, const Type &, const bool)"
                 );
  }
  union_enum = (EnumDef *)union_type;
  AddImport<flatbuffers::EnumDef>(&local_100,this,imports,&dependent->super_Definition,dependency);
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  paVar1 = &local_100.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.name._M_dataplus._M_p == paVar1) {
    local_180.field_2._8_8_ = local_100.name.field_2._8_8_;
  }
  else {
    local_180._M_dataplus._M_p = local_100.name._M_dataplus._M_p;
  }
  local_180.field_2._M_allocated_capacity._1_7_ = local_100.name.field_2._M_allocated_capacity._1_7_
  ;
  local_180.field_2._M_local_buf[0] = local_100.name.field_2._M_local_buf[0];
  local_180._M_string_length = local_100.name._M_string_length;
  local_100.name._M_string_length = 0;
  local_100.name.field_2._M_local_buf[0] = '\0';
  local_100.name._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.object_name._M_dataplus._M_p != &local_100.object_name.field_2) {
    operator_delete(local_100.object_name._M_dataplus._M_p,
                    local_100.object_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.rel_file_path._M_dataplus._M_p != &local_100.rel_file_path.field_2) {
    operator_delete(local_100.rel_file_path._M_dataplus._M_p,
                    local_100.rel_file_path.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.bare_file_path._M_dataplus._M_p != &local_100.bare_file_path.field_2) {
    operator_delete(local_100.bare_file_path._M_dataplus._M_p,
                    local_100.bare_file_path.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.export_statement._M_dataplus._M_p != &local_100.export_statement.field_2) {
    operator_delete(local_100.export_statement._M_dataplus._M_p,
                    local_100.export_statement.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.import_statement._M_dataplus._M_p != &local_100.import_statement.field_2) {
    operator_delete(local_100.import_statement._M_dataplus._M_p,
                    local_100.import_statement.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_100.name._M_dataplus._M_p,
                    CONCAT71(local_100.name.field_2._M_allocated_capacity._1_7_,
                             local_100.name.field_2._M_local_buf[0]) + 1);
  }
  std::operator+(&local_100.name,"this.",field_name);
  ppEVar4 = (dependency->vals).vec.
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_188 = (EnumVal **)
              std::
              __find_if<__gnu_cxx::__normal_iterator<flatbuffers::EnumVal*const*,std::vector<flatbuffers::EnumVal*,std::allocator<flatbuffers::EnumVal*>>>,__gnu_cxx::__ops::_Iter_pred<flatbuffers::ts::TsGenerator::UnionHasStringType(flatbuffers::EnumDef_const&)::_lambda(flatbuffers::EnumVal_const*)_1_>>
                        ((dependency->vals).vec.
                         super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,ppEVar4);
  std::operator+(&local_1f8,"this.",field_name);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1f8);
  local_1b8 = &local_1a8;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_1a8 = *plVar7;
    lStack_1a0 = plVar5[3];
  }
  else {
    local_1a8 = *plVar7;
    local_1b8 = (long *)*plVar5;
  }
  local_1b0 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_190 = ppEVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  local_198 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_198;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (is_array) {
    GenUnionListConvFuncName_abi_cxx11_(&local_1f8,this,dependency);
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
               0x37868f);
    GenObjApiUnionTypeTS
              (&local_238,this,imports,union_type->struct_def,(IDLOptions *)union_type->enum_def,
               union_enum);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,0x37872f);
    paVar1 = &local_258.field_2;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_258.field_2._M_allocated_capacity = *psVar8;
      local_258.field_2._8_8_ = plVar5[3];
      local_258._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_258.field_2._M_allocated_capacity = *psVar8;
      local_258._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_258._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_258);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_268 = *plVar7;
      lStack_260 = plVar5[3];
      local_278 = &local_268;
    }
    else {
      local_268 = *plVar7;
      local_278 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_278);
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    paVar2 = &local_238.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"TypeLength","");
    Namer::Method(&local_218,&(this->namer_).super_Namer,field_name,&local_1d8);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,0x37874b);
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_238.field_2._M_allocated_capacity = *psVar8;
      local_238.field_2._8_8_ = plVar5[3];
      local_238._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_238.field_2._M_allocated_capacity = *psVar8;
      local_238._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_238._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_238);
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_258.field_2._M_allocated_capacity = *psVar8;
      local_258.field_2._8_8_ = plVar5[3];
      local_258._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_258.field_2._M_allocated_capacity = *psVar8;
      local_258._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_258._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_258);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_268 = *plVar7;
      lStack_260 = plVar5[3];
      local_278 = &local_268;
    }
    else {
      local_268 = *plVar7;
      local_278 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_278);
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    paVar3 = &local_218.field_2;
    local_218._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"Type","");
    Namer::Method(&local_238,&(this->namer_).super_Namer,field_name,&local_218);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,0x3787a7);
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_258.field_2._M_allocated_capacity = *psVar8;
      local_258.field_2._8_8_ = plVar5[3];
      local_258._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_258.field_2._M_allocated_capacity = *psVar8;
      local_258._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_258._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_258);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_268 = *plVar7;
      lStack_260 = plVar5[3];
      local_278 = &local_268;
    }
    else {
      local_268 = *plVar7;
      local_278 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_278);
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar3) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_258,"      if(targetEnum === null || ",&local_180);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_258);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_268 = *plVar7;
      lStack_260 = plVar5[3];
      local_278 = &local_268;
    }
    else {
      local_268 = *plVar7;
      local_278 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_278);
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_218,"      const temp = ",&local_1f8);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_218);
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_238.field_2._M_allocated_capacity = *psVar8;
      local_238.field_2._8_8_ = plVar5[3];
      local_238._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_238.field_2._M_allocated_capacity = *psVar8;
      local_238._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_238._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_1b8);
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_258.field_2._M_allocated_capacity = *psVar8;
      local_258.field_2._8_8_ = plVar5[3];
      local_258._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_258.field_2._M_allocated_capacity = *psVar8;
      local_258._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_258._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_258);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_268 = *plVar7;
      lStack_260 = plVar5[3];
      local_278 = &local_268;
    }
    else {
      local_268 = *plVar7;
      local_278 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_278);
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar3) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    goto LAB_0025e16a;
  }
  GenUnionConvFuncName_abi_cxx11_(&local_1f8,this,dependency);
  std::__cxx11::string::_M_replace
            ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
             0x37868f);
  std::operator+(&local_120,"      const temp = ",&local_1f8);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_120);
  paVar1 = &local_1d8.field_2;
  puVar9 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_1d8.field_2._M_allocated_capacity = *puVar9;
    local_1d8.field_2._8_4_ = (undefined4)plVar5[3];
    local_1d8.field_2._12_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
    local_1d8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1d8.field_2._M_allocated_capacity = *puVar9;
    local_1d8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_1d8._M_string_length = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"Type","");
  Namer::Method(&local_160,&(this->namer_).super_Namer,field_name,&local_140);
  uVar10 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    uVar10 = local_1d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar10 < local_160._M_string_length + local_1d8._M_string_length) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      uVar10 = local_160.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_160._M_string_length + local_1d8._M_string_length) goto LAB_0025d828;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_160,0,(char *)0x0,(ulong)local_1d8._M_dataplus._M_p);
  }
  else {
LAB_0025d828:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_160._M_dataplus._M_p);
  }
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  psVar8 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_218.field_2._M_allocated_capacity = *psVar8;
    local_218.field_2._8_8_ = puVar6[3];
  }
  else {
    local_218.field_2._M_allocated_capacity = *psVar8;
    local_218._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_218._M_string_length = puVar6[1];
  *puVar6 = psVar8;
  puVar6[1] = 0;
  *(undefined1 *)psVar8 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_218);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_238.field_2._M_allocated_capacity = *psVar8;
    local_238.field_2._8_8_ = plVar5[3];
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  }
  else {
    local_238.field_2._M_allocated_capacity = *psVar8;
    local_238._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_238._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_1b8);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_258.field_2._M_allocated_capacity = *psVar8;
    local_258.field_2._8_8_ = plVar5[3];
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  }
  else {
    local_258.field_2._M_allocated_capacity = *psVar8;
    local_258._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_258._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_258);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_268 = *plVar7;
    lStack_260 = plVar5[3];
    local_278 = &local_268;
  }
  else {
    local_268 = *plVar7;
    local_278 = (long *)*plVar5;
  }
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_278);
  if (local_278 != &local_268) {
    operator_delete(local_278,local_268 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_0025e16a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,local_1a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.name._M_dataplus._M_p != &local_100.name.field_2) {
    operator_delete(local_100.name._M_dataplus._M_p,
                    CONCAT71(local_100.name.field_2._M_allocated_capacity._1_7_,
                             local_100.name.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenUnionValTS(import_set &imports, const StructDef &dependent,
                            const std::string &field_name,
                            const Type &union_type,
                            const bool is_array = false) {
    if (union_type.enum_def) {
      const auto &enum_def = *union_type.enum_def;
      const auto enum_type = AddImport(imports, dependent, enum_def).name;
      const std::string union_accessor = "this." + field_name;

      const auto union_has_string = UnionHasStringType(enum_def);
      const auto field_binded_method = "this." + field_name + ".bind(this)";

      std::string ret;

      if (!is_array) {
        const auto conversion_function = GenUnionConvFuncName(enum_def);

        ret = "(() => {\n";
        ret += "      const temp = " + conversion_function + "(this." +
               namer_.Method(field_name, "Type") + "(), " +
               field_binded_method + ");\n";
        ret += "      if(temp === null) { return null; }\n";
        ret += union_has_string
                   ? "      if(typeof temp === 'string') { return temp; }\n"
                   : "";
        ret += "      return temp.unpack()\n";
        ret += "  })()";
      } else {
        const auto conversion_function = GenUnionListConvFuncName(enum_def);

        ret = "(() => {\n";
        ret += "    const ret: (" +
               GenObjApiUnionTypeTS(imports, *union_type.struct_def,
                                    parser_.opts, *union_type.enum_def) +
               ")[] = [];\n";
        ret += "    for(let targetEnumIndex = 0; targetEnumIndex < this." +
               namer_.Method(field_name, "TypeLength") + "()" +
               "; "
               "++targetEnumIndex) {\n";
        ret += "      const targetEnum = this." +
               namer_.Method(field_name, "Type") + "(targetEnumIndex);\n";
        ret += "      if(targetEnum === null || " + enum_type +
               "[targetEnum!] === 'NONE') { "
               "continue; }\n\n";
        ret += "      const temp = " + conversion_function + "(targetEnum, " +
               field_binded_method + ", targetEnumIndex);\n";
        ret += "      if(temp === null) { continue; }\n";
        ret += union_has_string ? "      if(typeof temp === 'string') { "
                                  "ret.push(temp); continue; }\n"
                                : "";
        ret += "      ret.push(temp.unpack());\n";
        ret += "    }\n";
        ret += "    return ret;\n";
        ret += "  })()";
      }

      return ret;
    }

    FLATBUFFERS_ASSERT(0);
    return "";
  }